

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O3

void __thiscall capnp::PackedFdMessageReader::~PackedFdMessageReader(PackedFdMessageReader *this)

{
  ~PackedFdMessageReader(this);
  operator_delete(this,400);
  return;
}

Assistant:

PackedFdMessageReader::~PackedFdMessageReader() noexcept(false) {}